

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabFactory.H
# Opt level: O2

TagBox * __thiscall
amrex::DefaultFabFactory<amrex::TagBox>::create
          (DefaultFabFactory<amrex::TagBox> *this,Box *box,int ncomps,FabInfo *info,int param_4)

{
  TagBox *this_00;
  
  this_00 = (TagBox *)operator_new(0x48);
  TagBox::TagBox(this_00,box,ncomps,info->alloc,info->shared,info->arena);
  return this_00;
}

Assistant:

AMREX_NODISCARD
    virtual FAB* create (const Box& box, int ncomps, const FabInfo& info, int /*box_index*/) const override
    {
        return new FAB(box, ncomps, info.alloc, info.shared, info.arena);
    }